

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_lshd(mp_int *a,int b)

{
  undefined8 *puVar1;
  int in_ESI;
  int *in_RDI;
  mp_digit *bottom;
  mp_digit *top;
  int res;
  int x;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  mp_int *in_stack_ffffffffffffffd8;
  int local_18;
  int local_4;
  
  if (in_ESI < 1) {
    local_4 = 0;
  }
  else if ((*in_RDI + in_ESI <= in_RDI[1]) ||
          (local_4 = mp_grow(in_stack_ffffffffffffffd8,
                             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20)), local_4 == 0)) {
    *in_RDI = in_ESI + *in_RDI;
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)*in_RDI * 8);
    local_18 = *in_RDI;
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)*in_RDI * 8 + -8 + (long)in_ESI * -8);
    while( true ) {
      local_18 = local_18 + -1;
      puVar1 = puVar1 + -1;
      if (local_18 < in_ESI) break;
      *puVar1 = *puVar2;
      puVar2 = puVar2 + -1;
    }
    puVar1 = *(undefined8 **)(in_RDI + 4);
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      *puVar1 = 0;
      puVar1 = puVar1 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_lshd (mp_int * a, int b)
{
  int     x, res;

  /* if its less than zero return */
  if (b <= 0) {
    return MP_OKAY;
  }

  /* grow to fit the new digits */
  if (a->alloc < a->used + b) {
     if ((res = mp_grow (a, a->used + b)) != MP_OKAY) {
       return res;
     }
  }

  {
    register mp_digit *top, *bottom;

    /* increment the used by the shift amount then copy upwards */
    a->used += b;

    /* top */
    top = a->dp + a->used - 1;

    /* base */
    bottom = a->dp + a->used - 1 - b;

    /* much like mp_rshd this is implemented using a sliding window
     * except the window goes the otherway around.  Copying from
     * the bottom to the top.  see bn_mp_rshd.c for more info.
     */
    for (x = a->used - 1; x >= b; x--) {
      *top-- = *bottom--;
    }

    /* zero the lower digits */
    top = a->dp;
    for (x = 0; x < b; x++) {
      *top++ = 0;
    }
  }
  return MP_OKAY;
}